

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O1

bool __thiscall zmq::msg_t::rm_refs(msg_t *this,int refs_)

{
  atomic_counter_t *paVar1;
  uchar uVar2;
  content_t *pcVar3;
  int __fd;
  
  __fd = refs_;
  if (refs_ < 0) {
    rm_refs();
  }
  if ((this->_u).base.metadata != (metadata_t *)0x0) {
    rm_refs();
  }
  if (refs_ == 0) {
    return true;
  }
  uVar2 = (this->_u).base.type;
  if (((uVar2 == 'i') || (uVar2 == 'f')) && ((char)(this->_u).base.flags < '\0')) {
    if (uVar2 == 'f') {
      LOCK();
      paVar1 = &((this->_u).lmsg.content)->refcnt;
      (paVar1->_value).super___atomic_base<unsigned_int>._M_i =
           (paVar1->_value).super___atomic_base<unsigned_int>._M_i - refs_;
      UNLOCK();
      if ((paVar1->_value).super___atomic_base<unsigned_int>._M_i == 0) {
        pcVar3 = (this->_u).lmsg.content;
        if ((code *)pcVar3->ffn != (code *)0x0) {
          (*(code *)pcVar3->ffn)(pcVar3->data,pcVar3->hint);
        }
        free((this->_u).cmsg.data);
        return false;
      }
    }
    if ((this->_u).base.type != 'i') {
      return true;
    }
    LOCK();
    paVar1 = &((this->_u).lmsg.content)->refcnt;
    (paVar1->_value).super___atomic_base<unsigned_int>._M_i =
         (paVar1->_value).super___atomic_base<unsigned_int>._M_i - refs_;
    UNLOCK();
    if ((paVar1->_value).super___atomic_base<unsigned_int>._M_i != 0) {
      return true;
    }
    pcVar3 = (this->_u).lmsg.content;
    if ((code *)pcVar3->ffn != (code *)0x0) {
      (*(code *)pcVar3->ffn)(pcVar3->data,pcVar3->hint);
    }
  }
  else {
    close(this,__fd);
  }
  return false;
}

Assistant:

bool zmq::msg_t::rm_refs (int refs_)
{
    zmq_assert (refs_ >= 0);

    //  Operation not supported for messages with metadata.
    zmq_assert (_u.base.metadata == NULL);

    //  No copies required.
    if (!refs_)
        return true;

    //  If there's only one reference close the message.
    if ((_u.base.type != type_zclmsg && _u.base.type != type_lmsg)
        || !(_u.base.flags & msg_t::shared)) {
        close ();
        return false;
    }

    //  The only message type that needs special care are long and zcopy messages.
    if (_u.base.type == type_lmsg && !_u.lmsg.content->refcnt.sub (refs_)) {
        //  We used "placement new" operator to initialize the reference
        //  counter so we call the destructor explicitly now.
        _u.lmsg.content->refcnt.~atomic_counter_t ();

        if (_u.lmsg.content->ffn)
            _u.lmsg.content->ffn (_u.lmsg.content->data, _u.lmsg.content->hint);
        free (_u.lmsg.content);

        return false;
    }

    if (is_zcmsg () && !_u.zclmsg.content->refcnt.sub (refs_)) {
        // storage for rfcnt is provided externally
        if (_u.zclmsg.content->ffn) {
            _u.zclmsg.content->ffn (_u.zclmsg.content->data,
                                    _u.zclmsg.content->hint);
        }

        return false;
    }

    return true;
}